

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O3

double av1_highbd_estimate_noise_from_single_plane_c
                 (uint16_t *src16,int height,int width,int stride,int bit_depth,int edge_thresh)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  byte bVar5;
  long lVar6;
  int iVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  bool bVar13;
  double dVar14;
  long local_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  ulong local_50;
  int mat [3] [3];
  
  mat[0]._0_8_ = ZEXT48((uint)width);
  dVar14 = -1.0;
  if (2 < height) {
    local_50 = (ulong)(height - 1);
    bVar5 = (char)bit_depth - 8;
    iVar11 = (1 << (bVar5 & 0x1f)) >> 1;
    lVar9 = 0;
    mat._8_8_ = 1;
    local_80 = 0;
    iVar3 = 0;
    do {
      mat[1]._4_8_ = lVar9;
      if (2 < (int)mat[0]._0_8_) {
        iVar12 = 1;
        do {
          lVar6 = -1;
          piVar8 = &local_78;
          lVar10 = lVar9;
          do {
            lVar6 = lVar6 + 1;
            lVar4 = 0;
            do {
              piVar8[lVar4] = (uint)src16[(int)lVar10 + (int)lVar4];
              lVar4 = lVar4 + 1;
            } while (lVar4 != 3);
            lVar10 = lVar10 + (ulong)(uint)stride;
            piVar8 = piVar8 + 3;
          } while (lVar6 != 2);
          iVar1 = (((local_78 + local_60) - local_70) - local_58) + (local_6c - local_64) * 2;
          iVar7 = (((local_70 + local_78) - local_60) - local_58) + (local_74 - local_5c) * 2;
          iVar2 = -iVar1;
          if (0 < iVar1) {
            iVar2 = iVar1;
          }
          iVar1 = -iVar7;
          if (0 < iVar7) {
            iVar1 = iVar7;
          }
          if (iVar2 + iVar11 + iVar1 >> (bVar5 & 0x1f) < edge_thresh) {
            iVar1 = local_70 + local_78 + local_60 + local_58 +
                    (local_74 + local_5c + local_64 + local_6c) * -2 + local_68 * 4;
            iVar7 = -iVar1;
            if (0 < iVar1) {
              iVar7 = iVar1;
            }
            local_80 = local_80 + (iVar7 + iVar11 >> (bVar5 & 0x1f));
            iVar3 = iVar3 + 1;
          }
          lVar9 = lVar9 + 1;
          bVar13 = iVar12 != width + -2;
          iVar12 = iVar12 + 1;
        } while (bVar13);
      }
      mat._8_8_ = mat._8_8_ + 1;
      lVar9 = mat[1]._4_8_ + (ulong)(uint)stride;
    } while (mat._8_8_ != local_50);
    if (0xf < iVar3) {
      dVar14 = ((double)local_80 / (double)(iVar3 * 6)) * 1.25331413732;
    }
  }
  return dVar14;
}

Assistant:

double av1_highbd_estimate_noise_from_single_plane_c(const uint16_t *src16,
                                                     int height, int width,
                                                     const int stride,
                                                     int bit_depth,
                                                     int edge_thresh) {
  int64_t accum = 0;
  int count = 0;
  for (int i = 1; i < height - 1; ++i) {
    for (int j = 1; j < width - 1; ++j) {
      // Setup a small 3x3 matrix.
      const int center_idx = i * stride + j;
      int mat[3][3];
      for (int ii = -1; ii <= 1; ++ii) {
        for (int jj = -1; jj <= 1; ++jj) {
          const int idx = center_idx + ii * stride + jj;
          mat[ii + 1][jj + 1] = src16[idx];
        }
      }
      // Compute sobel gradients.
      const int Gx = (mat[0][0] - mat[0][2]) + (mat[2][0] - mat[2][2]) +
                     2 * (mat[1][0] - mat[1][2]);
      const int Gy = (mat[0][0] - mat[2][0]) + (mat[0][2] - mat[2][2]) +
                     2 * (mat[0][1] - mat[2][1]);
      const int Ga = ROUND_POWER_OF_TWO(abs(Gx) + abs(Gy), bit_depth - 8);
      // Accumulate Laplacian.
      if (Ga < edge_thresh) {  // Only count smooth pixels.
        const int v = 4 * mat[1][1] -
                      2 * (mat[0][1] + mat[2][1] + mat[1][0] + mat[1][2]) +
                      (mat[0][0] + mat[0][2] + mat[2][0] + mat[2][2]);
        accum += ROUND_POWER_OF_TWO(abs(v), bit_depth - 8);
        ++count;
      }
    }
  }

  // Return -1.0 (unreliable estimation) if there are too few smooth pixels.
  return (count < 16) ? -1.0 : (double)accum / (6 * count) * SQRT_PI_BY_2;
}